

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes.cpp
# Opt level: O2

uint32_t nivalis::OpCode::from_char(char opchar)

{
  uint32_t uVar1;
  undefined3 in_register_00000039;
  int iVar2;
  
  iVar2 = CONCAT31(in_register_00000039,opchar);
  switch(iVar2) {
  case 0x25:
    uVar1 = 0x32;
    break;
  case 0x26:
    uVar1 = 0x52;
    break;
  case 0x2a:
    uVar1 = 0x30;
    break;
  case 0x2b:
    uVar1 = 0x20;
    break;
  case 0x2d:
    uVar1 = 0x21;
    break;
  case 0x2f:
    uVar1 = 0x31;
    break;
  default:
    if (iVar2 == 0x3c) {
      return 0x60;
    }
    if (iVar2 == 0x3d) {
      return 0x62;
    }
    if (iVar2 == 0x3e) {
      return 0x65;
    }
    if (iVar2 == 0x5e) {
      return 0x40;
    }
    if (iVar2 == 0x7c) {
      return 0x53;
    }
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x2c:
  case 0x2e:
    uVar1 = 0x18;
  }
  return uVar1;
}

Assistant:

uint32_t from_char(char opchar) {
    switch (opchar) {
        case '+': return OpCode::add;
        case '-': return OpCode::sub;
        case '*': return OpCode::mul;
        case '/': return OpCode::divi;
        case '%': return OpCode::mod;
        case '^': return OpCode::power;
        case '<': return OpCode::lt;
        case '>': return OpCode::gt;
        case '=': return OpCode::eq;
        case '&': return OpCode::land;
        case '|': return OpCode::lor;
        default: return OpCode::bsel;
    };
}